

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequence.cpp
# Opt level: O1

QString * __thiscall
QKeySequence::toString(QString *__return_storage_ptr__,QKeySequence *this,SequenceFormat format)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  piVar1 = this->d->key;
  local_50.d.d._0_4_ = 0;
  piVar2 = std::__find_if<int*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>(piVar1,this->d + 1);
  uVar4 = (uint)((ulong)((long)piVar2 - (long)piVar1) >> 2);
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      QKeySequencePrivate::encodeString(&local_50,(QKeyCombination)this->d->key[uVar3],format);
      QString::append(__return_storage_ptr__);
      piVar1 = (int *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_),2,0x10);
        }
      }
      QVar5.m_data = (char *)0x2;
      QVar5.m_size = (qsizetype)__return_storage_ptr__;
      QString::append(QVar5);
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  QString::truncate((longlong)__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QKeySequence::toString(SequenceFormat format) const
{
    QString finalString;
    // A standard string, with no translation or anything like that. In some ways it will
    // look like our latin case on Windows and X11
    int end = count();
    for (int i = 0; i < end; ++i) {
        finalString += d->encodeString(QKeyCombination::fromCombined(d->key[i]), format);
        finalString += ", "_L1;
    }
    finalString.truncate(finalString.size() - 2);
    return finalString;
}